

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::~IfcRailing(IfcRailing *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x940be8;
  *(undefined8 *)&this->field_0x180 = 0x940d00;
  *(undefined8 *)&this->field_0x88 = 0x940c10;
  *(undefined8 *)&this->field_0x98 = 0x940c38;
  *(undefined8 *)&this->field_0xd0 = 0x940c60;
  *(undefined8 *)&this->field_0x100 = 0x940c88;
  *(undefined8 *)&this->field_0x138 = 0x940cb0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x940cd8;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__00940d20);
  operator_delete(this,0x198);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}